

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::Server::process_request
          (Server *this,Stream *strm,bool close_connection,bool *connection_closed,
          function<void_(httplib::Request_&)> *setup_request)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  __ssize_t _Var6;
  iterator iVar7;
  _Base_ptr p_Var8;
  string *psVar9;
  FILE *__stream;
  size_t sVar10;
  size_t *__n;
  char **__lineptr;
  int status;
  Headers dummy;
  stream_line_reader line_reader;
  Response res;
  Request req;
  array<char,_2048UL> buf;
  
  __lineptr = (char **)0x0;
  __stream = (FILE *)connection_closed;
  memset(&buf,0,0x800);
  line_reader.fixed_buffer_size_ = 0x800;
  line_reader.fixed_buffer_used_size_ = 0;
  line_reader.glowable_buffer_._M_dataplus._M_p = (pointer)&line_reader.glowable_buffer_.field_2;
  line_reader.glowable_buffer_._M_string_length = 0;
  line_reader.glowable_buffer_.field_2._M_local_buf[0] = '\0';
  line_reader.strm_ = strm;
  line_reader.fixed_buffer_ = buf._M_elems;
  _Var6 = detail::stream_line_reader::getline(&line_reader,__lineptr,__n,__stream);
  if ((char)_Var6 == '\0') {
    bVar2 = 0;
    goto LAB_001352ca;
  }
  req.method._M_dataplus._M_p = (pointer)&req.method.field_2;
  req.method._M_string_length = 0;
  req.method.field_2._M_local_buf[0] = '\0';
  req.path._M_dataplus._M_p = (pointer)&req.path.field_2;
  req.path._M_string_length = 0;
  req.path.field_2._M_local_buf[0] = '\0';
  req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &req.headers._M_t._M_impl.super__Rb_tree_header._M_header;
  req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  req.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  req.body._M_dataplus._M_p = (pointer)&req.body.field_2;
  req.body._M_string_length = 0;
  req.body.field_2._M_local_buf[0] = '\0';
  req.remote_addr._M_dataplus._M_p = (pointer)&req.remote_addr.field_2;
  req.remote_addr._M_string_length = 0;
  req.remote_addr.field_2._M_local_buf[0] = '\0';
  req.remote_port = -1;
  req.version._M_dataplus._M_p = (pointer)&req.version.field_2;
  req.version._M_string_length = 0;
  req.version.field_2._M_local_buf[0] = '\0';
  req.target._M_dataplus._M_p = (pointer)&req.target.field_2;
  req.target._M_string_length = 0;
  req.target.field_2._M_local_buf[0] = '\0';
  req.params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &req.params._M_t._M_impl.super__Rb_tree_header._M_header;
  req.params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  req.params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  req.params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  req.files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &req.files._M_t._M_impl.super__Rb_tree_header._M_header;
  req.files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  req.files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  req.params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       req.params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  req.files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       req.files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  memset(&req.files._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0xa0);
  req.redirect_count_ = 0x14;
  req.authorization_count_ = 0;
  res.version._M_dataplus._M_p = (pointer)&res.version.field_2;
  res.version._M_string_length = 0;
  res.version.field_2._M_local_buf[0] = '\0';
  res.status = -1;
  res.reason._M_dataplus._M_p = (pointer)&res.reason.field_2;
  res.reason._M_string_length = 0;
  res.reason.field_2._M_local_buf[0] = '\0';
  p_Var1 = &res.headers._M_t._M_impl.super__Rb_tree_header;
  res.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  res.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  res.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  res.body._M_dataplus._M_p = (pointer)&res.body.field_2;
  res.body._M_string_length = 0;
  req.content_length_ = 0;
  req.content_provider_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  res.body.field_2._M_local_buf[0] = '\0';
  res.location._M_dataplus._M_p = (pointer)&res.location.field_2;
  res.location._M_string_length = 0;
  req.content_provider_.super__Function_base._M_functor._8_8_ = 0;
  req.content_provider_.super__Function_base._M_manager._0_1_ = 0;
  req.content_provider_.super__Function_base._M_manager._1_7_ = 0;
  req.content_provider_._M_invoker._0_1_ = 0;
  req._537_8_ = 0;
  res.location.field_2._M_local_buf[0] = '\0';
  res.content_length_ = 0;
  res.content_provider_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  res.content_provider_.super__Function_base._M_functor._8_8_ = 0;
  res.content_provider_.super__Function_base._M_manager = (_Manager_type)0x0;
  res.content_provider_._M_invoker = (_Invoker_type)0x0;
  res.content_provider_resource_releaser_.super__Function_base._M_functor._M_unused._M_object =
       (void *)0x0;
  res.content_provider_resource_releaser_.super__Function_base._M_functor._8_8_ = 0;
  res.content_provider_resource_releaser_.super__Function_base._M_manager._0_2_ = 0;
  res.content_provider_resource_releaser_.super__Function_base._M_manager._2_6_ = 0;
  res.content_provider_resource_releaser_._M_invoker._0_2_ = 0;
  res._250_8_ = 0;
  res.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  res.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::__cxx11::string::assign((char *)&res);
  for (p_Var8 = (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != &(this->default_headers_)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&res.headers._M_t,(key_type *)(p_Var8 + 1));
    if ((_Rb_tree_header *)iVar7._M_node == p_Var1) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_insert_equal<std::pair<std::__cxx11::string_const,std::__cxx11::string>const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&res.headers,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(p_Var8 + 1));
    }
  }
  iVar5 = (*strm->_vptr_Stream[7])(strm);
  if (iVar5 < 0x400) {
    sVar10 = line_reader.glowable_buffer_._M_string_length;
    if (line_reader.glowable_buffer_._M_string_length == 0) {
      sVar10 = line_reader.fixed_buffer_used_size_;
    }
    if (sVar10 < 0x2001) {
      psVar9 = (string *)&line_reader.fixed_buffer_;
      if (line_reader.glowable_buffer_._M_string_length != 0) {
        psVar9 = &line_reader.glowable_buffer_;
      }
      bVar3 = parse_request_line(this,(psVar9->_M_dataplus)._M_p,&req);
      if (bVar3) {
        bVar3 = detail::read_headers(strm,&req.headers);
        if (bVar3) {
          Request::get_header_value_abi_cxx11_((string *)&dummy,&req,"Connection",0);
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&dummy,"close");
          std::__cxx11::string::~string((string *)&dummy);
          if (bVar3) {
            *connection_closed = true;
          }
          bVar3 = std::operator==(&req.version,"HTTP/1.0");
          if (bVar3) {
            Request::get_header_value_abi_cxx11_((string *)&dummy,&req,"Connection",0);
            bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&dummy,"Keep-Alive");
            std::__cxx11::string::~string((string *)&dummy);
            if (bVar3) {
              *connection_closed = true;
            }
          }
          (*strm->_vptr_Stream[6])(strm,&req.remote_addr,&req.remote_port);
          Request::set_header(&req,"REMOTE_ADDR",&req.remote_addr);
          std::__cxx11::to_string((string *)&dummy,req.remote_port);
          Request::set_header(&req,"REMOTE_PORT",(string *)&dummy);
          std::__cxx11::string::~string((string *)&dummy);
          bVar3 = detail::has_header(&req.headers,"Range");
          if (bVar3) {
            Request::get_header_value_abi_cxx11_((string *)&dummy,&req,"Range",0);
            bVar3 = detail::parse_range_header((string *)&dummy,&req.ranges);
            if (!bVar3) {
              res.status = 0x1a0;
              bVar4 = write_response(this,strm,close_connection,&req,&res);
              p_Var8 = (_Base_ptr)(ulong)bVar4;
            }
            bVar2 = (byte)p_Var8;
            std::__cxx11::string::~string((string *)&dummy);
            if (!bVar3) goto LAB_001352b0;
          }
          if ((setup_request->super__Function_base)._M_manager != (_Manager_type)0x0) {
            std::function<void_(httplib::Request_&)>::operator()(setup_request,&req);
          }
          Request::get_header_value_abi_cxx11_((string *)&dummy,&req,"Expect",0);
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&dummy,"100-continue");
          std::__cxx11::string::~string((string *)&dummy);
          if (bVar3) {
            status = 100;
            if ((((this->expect_100_continue_handler_).super__Function_base._M_manager !=
                  (_Manager_type)0x0) &&
                (status = std::function<int_(const_httplib::Request_&,_httplib::Response_&)>::
                          operator()(&this->expect_100_continue_handler_,&req,&res), status != 0x1a1
                )) && (status != 100)) {
              bVar2 = write_response(this,strm,close_connection,&req,&res);
              goto LAB_001352b0;
            }
            dummy._M_t._M_impl._0_8_ = detail::status_message(status);
            Stream::write_format<int,char_const*>
                      (strm,"HTTP/1.1 %d %s\r\n\r\n",&status,(char **)&dummy);
          }
          bVar3 = routing(this,&req,&res,strm);
          if (bVar3) {
            if (res.status == -1) {
              res.status = 0xce;
              if (req.ranges.
                  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  req.ranges.
                  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                res.status = 200;
              }
            }
            bVar2 = write_response_with_content(this,strm,close_connection,&req,&res);
          }
          else {
            if (res.status == -1) {
              res.status = 0x194;
            }
            bVar2 = write_response(this,strm,close_connection,&req,&res);
          }
          goto LAB_001352b0;
        }
      }
      res.status = 400;
      bVar2 = write_response(this,strm,close_connection,&req,&res);
    }
    else {
      dummy._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &dummy._M_t._M_impl.super__Rb_tree_header._M_header;
      dummy._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      dummy._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      dummy._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      dummy._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           dummy._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      detail::read_headers(strm,&dummy);
      res.status = 0x19e;
      bVar2 = write_response(this,strm,close_connection,&req,&res);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&dummy._M_t);
    }
  }
  else {
    dummy._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &dummy._M_t._M_impl.super__Rb_tree_header._M_header;
    dummy._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    dummy._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    dummy._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    dummy._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         dummy._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    detail::read_headers(strm,&dummy);
    res.status = 500;
    bVar2 = write_response(this,strm,close_connection,&req,&res);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&dummy._M_t);
  }
LAB_001352b0:
  Response::~Response(&res);
  Request::~Request(&req);
LAB_001352ca:
  std::__cxx11::string::~string((string *)&line_reader.glowable_buffer_);
  return (bool)(bVar2 & 1);
}

Assistant:

inline bool
Server::process_request(Stream &strm, bool close_connection,
                        bool &connection_closed,
                        const std::function<void(Request &)> &setup_request) {
  std::array<char, 2048> buf{};

  detail::stream_line_reader line_reader(strm, buf.data(), buf.size());

  // Connection has been closed on client
  if (!line_reader.getline()) { return false; }

  Request req;
  Response res;

  res.version = "HTTP/1.1";

  for (const auto &header : default_headers_) {
    if (res.headers.find(header.first) == res.headers.end()) {
      res.headers.insert(header);
    }
  }

#ifdef _WIN32
  // TODO: Increase FD_SETSIZE statically (libzmq), dynamically (MySQL).
#else
#ifndef CPPHTTPLIB_USE_POLL
  // Socket file descriptor exceeded FD_SETSIZE...
  if (strm.socket() >= FD_SETSIZE) {
    Headers dummy;
    detail::read_headers(strm, dummy);
    res.status = 500;
    return write_response(strm, close_connection, req, res);
  }
#endif
#endif

  // Check if the request URI doesn't exceed the limit
  if (line_reader.size() > CPPHTTPLIB_REQUEST_URI_MAX_LENGTH) {
    Headers dummy;
    detail::read_headers(strm, dummy);
    res.status = 414;
    return write_response(strm, close_connection, req, res);
  }

  // Request line and headers
  if (!parse_request_line(line_reader.ptr(), req) ||
      !detail::read_headers(strm, req.headers)) {
    res.status = 400;
    return write_response(strm, close_connection, req, res);
  }

  if (req.get_header_value("Connection") == "close") {
    connection_closed = true;
  }

  if (req.version == "HTTP/1.0" &&
      req.get_header_value("Connection") != "Keep-Alive") {
    connection_closed = true;
  }

  strm.get_remote_ip_and_port(req.remote_addr, req.remote_port);
  req.set_header("REMOTE_ADDR", req.remote_addr);
  req.set_header("REMOTE_PORT", std::to_string(req.remote_port));

  if (req.has_header("Range")) {
    const auto &range_header_value = req.get_header_value("Range");
    if (!detail::parse_range_header(range_header_value, req.ranges)) {
      res.status = 416;
      return write_response(strm, close_connection, req, res);
    }
  }

  if (setup_request) { setup_request(req); }

  if (req.get_header_value("Expect") == "100-continue") {
    auto status = 100;
    if (expect_100_continue_handler_) {
      status = expect_100_continue_handler_(req, res);
    }
    switch (status) {
    case 100:
    case 417:
      strm.write_format("HTTP/1.1 %d %s\r\n\r\n", status,
                        detail::status_message(status));
      break;
    default: return write_response(strm, close_connection, req, res);
    }
  }

  // Rounting
  bool routed = false;
#ifdef CPPHTTPLIB_NO_EXCEPTIONS
  routed = routing(req, res, strm);
#else
  try {
    routed = routing(req, res, strm);
  } catch (std::exception &e) {
    if (exception_handler_) {
      exception_handler_(req, res, e);
      routed = true;
    } else {
      res.status = 500;
      res.set_header("EXCEPTION_WHAT", e.what());
    }
  } catch (...) {
    res.status = 500;
    res.set_header("EXCEPTION_WHAT", "UNKNOWN");
  }
#endif

  if (routed) {
    if (res.status == -1) { res.status = req.ranges.empty() ? 200 : 206; }
    return write_response_with_content(strm, close_connection, req, res);
  } else {
    if (res.status == -1) { res.status = 404; }
    return write_response(strm, close_connection, req, res);
  }
}